

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

void add_depth(borg_calculation *f,int pos)

{
  token_type tVar1;
  int iVar2;
  void *pvVar3;
  token_type *ptVar4;
  _Bool _Var5;
  int local_28;
  int end;
  int i;
  int pdepth;
  token *tok;
  int pos_local;
  borg_calculation *f_local;
  
  pvVar3 = f->token_array->items[pos];
  tVar1 = *(token_type *)((long)pvVar3 + 0x10);
  *(int *)((long)pvVar3 + 0x10) = *(int *)((long)pvVar3 + 0x10) + 1;
  local_28 = pos + -1;
  while (((-1 < local_28 &&
          (ptVar4 = (token_type *)f->token_array->items[local_28], (int)tVar1 <= (int)ptVar4[4])) &&
         ((_Var5 = is_operator(*ptVar4), !_Var5 || (ptVar4[4] != tVar1))))) {
    ptVar4[4] = ptVar4[4] + TOK_VALUE;
    if (f->max_depth < (int)ptVar4[4]) {
      f->max_depth = ptVar4[4];
    }
    local_28 = local_28 + -1;
  }
  iVar2 = f->token_array->count;
  local_28 = pos + 1;
  while (((local_28 < iVar2 &&
          (ptVar4 = (token_type *)f->token_array->items[local_28], (int)tVar1 <= (int)ptVar4[4])) &&
         ((_Var5 = is_operator(*ptVar4), !_Var5 || (ptVar4[4] != tVar1))))) {
    ptVar4[4] = ptVar4[4] + TOK_VALUE;
    if (f->max_depth < (int)ptVar4[4]) {
      f->max_depth = ptVar4[4];
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void add_depth(struct borg_calculation *f, int pos)
{
    struct token *tok    = f->token_array->items[pos];
    int           pdepth = tok->pdepth;
    int           i;

    tok->pdepth++;

    /* left */
    for (i = pos - 1; i >= 0; i--) {
        tok = f->token_array->items[i];
        /* check for after this operand*/
        if (tok->pdepth < pdepth
            || (is_operator(tok->type) && tok->pdepth == pdepth))
            break;
        tok->pdepth++;
        if (tok->pdepth > f->max_depth)
            f->max_depth = tok->pdepth;
    }
    /* right */
    int end = f->token_array->count;
    for (i = pos + 1; i < end; i++) {
        tok = f->token_array->items[i];
        if (tok->pdepth < pdepth
            || (is_operator(tok->type) && tok->pdepth == pdepth))
            break;
        tok->pdepth++;
        if (tok->pdepth > f->max_depth)
            f->max_depth = tok->pdepth;
    }
}